

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O0

int constructFixedHeader(BUFFER_HANDLE ctrlPacket,CONTROL_PACKET_TYPE packetType,uint8_t flags)

{
  size_t sVar1;
  int iVar2;
  BUFFER_HANDLE handle;
  byte *pbVar3;
  uint8_t *iterator;
  BUFFER_HANDLE fixedHeader;
  size_t sStack_38;
  uint8_t encode;
  size_t index;
  size_t sStack_28;
  uint8_t remainSize [4];
  size_t packetLen;
  int result;
  uint8_t flags_local;
  CONTROL_PACKET_TYPE packetType_local;
  BUFFER_HANDLE ctrlPacket_local;
  
  sStack_28 = BUFFER_length(ctrlPacket);
  memset((void *)((long)&index + 4),0,4);
  sStack_38 = 0;
  sVar1 = sStack_38;
  do {
    sStack_38 = sVar1;
    fixedHeader._7_1_ = (byte)sStack_28 & 0x7f;
    sStack_28 = sStack_28 >> 7;
    if (sStack_28 != 0) {
      fixedHeader._7_1_ = fixedHeader._7_1_ | 0x80;
    }
    *(byte *)((long)&index + sStack_38 + 4) = fixedHeader._7_1_;
    sVar1 = sStack_38 + 1;
  } while (sStack_28 != 0);
  handle = BUFFER_new();
  if (handle == (BUFFER_HANDLE)0x0) {
    packetLen._4_4_ = 0x167;
  }
  else {
    iVar2 = BUFFER_pre_build(handle,sStack_38 + 2);
    if (iVar2 == 0) {
      pbVar3 = BUFFER_u_char(handle);
      *pbVar3 = (byte)packetType | flags;
      memcpy(pbVar3 + 1,(void *)((long)&index + 4),sStack_38 + 1);
      packetLen._4_4_ = BUFFER_prepend(ctrlPacket,handle);
      BUFFER_delete(handle);
    }
    else {
      BUFFER_delete(handle);
      packetLen._4_4_ = 0x16c;
    }
  }
  return packetLen._4_4_;
}

Assistant:

static int constructFixedHeader(BUFFER_HANDLE ctrlPacket, CONTROL_PACKET_TYPE packetType, uint8_t flags)
{
    int result;
    size_t packetLen = BUFFER_length(ctrlPacket);
    uint8_t remainSize[4] ={ 0 };
    size_t index = 0;

    // Calculate the length of packet
    do
    {
        uint8_t encode = packetLen % 128;
        packetLen /= 128;
        // if there are more data to encode, set the top bit of this byte
        if (packetLen > 0)
        {
            encode |= NEXT_128_CHUNK;
        }
        remainSize[index++] = encode;
    } while (packetLen > 0);

    BUFFER_HANDLE fixedHeader = BUFFER_new();
    if (fixedHeader == NULL)
    {
        result = MU_FAILURE;
    }
    else if (BUFFER_pre_build(fixedHeader, index + 1) != 0)
    {
        BUFFER_delete(fixedHeader);
        result = MU_FAILURE;
    }
    else
    {
        uint8_t* iterator = BUFFER_u_char(fixedHeader);
        *iterator = (uint8_t)packetType | flags;
        iterator++;
        (void)memcpy(iterator, remainSize, index);

        result = BUFFER_prepend(ctrlPacket, fixedHeader);
        BUFFER_delete(fixedHeader);
    }
    return result;
}